

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

Vector<unsigned_int,_2> __thiscall
gl4cts::Math::lessThan<2>(Math *this,Vector<double,_2> *left,Vector<double,_2> *right)

{
  Vector<unsigned_int,_2> *result;
  int i;
  long lVar1;
  Vector<bool,_2> res;
  
  result = (Vector<unsigned_int,_2> *)this;
  res.m_data[0] = false;
  res.m_data[1] = false;
  lVar1 = 0;
  do {
    res.m_data[lVar1] =
         left->m_data[lVar1] <= right->m_data[lVar1] && right->m_data[lVar1] != left->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  *(undefined8 *)this = 0;
  lVar1 = 0;
  do {
    *(uint *)(this + lVar1 * 4) = (uint)res.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  return (Vector<unsigned_int,_2>)result;
}

Assistant:

static tcu::Vector<glw::GLuint, Size> lessThan(const tcu::Vector<glw::GLdouble, Size>& left,
											   const tcu::Vector<glw::GLdouble, Size>& right)
{
	return convertBvecToUvec(tcu::lessThan(left, right));
}